

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O2

void mahjong::adjust_by_waiting_form
               (pack_t *concealed_packs,intptr_t pack_cnt,tile_t *standing_tiles,
               intptr_t standing_cnt,tile_t win_tile,fan_table_t *fan_table)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  difference_type dVar8;
  byte bVar9;
  useful_table_t waiting_table;
  useful_table_t temp_table;
  bool local_c8 [80];
  bool local_78 [72];
  
  if ((*fan_table)[5] == 0 && (*fan_table)[0x34] == 0) {
    bVar6 = is_basic_form_wait(standing_tiles,standing_cnt,(useful_table_t *)local_c8);
    if (bVar6) {
      if ((pack_cnt == 5) &&
         (bVar6 = is_seven_pairs_wait(standing_tiles,standing_cnt,&local_78), bVar6)) {
        for (lVar7 = 0; lVar7 != 0x48; lVar7 = lVar7 + 1) {
          local_c8[lVar7] = (bool)(local_c8[lVar7] | local_78[lVar7]);
        }
      }
      local_78[0] = true;
      dVar8 = std::__count_if<bool*,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                        (local_c8,local_c8 + 0x48,(_Iter_equals_val<const_bool>)local_78);
      if (dVar8 == 1) {
        lVar7 = 0;
        if (pack_cnt < 1) {
          pack_cnt = lVar7;
        }
        bVar3 = false;
        bVar2 = false;
        bVar6 = false;
        for (; pack_cnt != lVar7; lVar7 = lVar7 + 1) {
          uVar1 = concealed_packs[lVar7];
          bVar9 = (byte)uVar1;
          if (((byte)(uVar1 >> 8) & 0xf) == 4) {
            bVar4 = false;
            bVar5 = true;
            if (bVar9 != win_tile) {
              bVar4 = bVar2;
              bVar5 = bVar3;
            }
          }
          else {
            bVar4 = bVar2;
            bVar5 = bVar3;
            if ((uVar1 >> 8 & 0xf) == 1) {
              bVar5 = false;
              if (bVar9 == win_tile) {
                bVar4 = true;
              }
              else {
                bVar6 = (bool)(bVar6 | (bVar9 - 1 == (uint)win_tile || bVar9 + 1 == (uint)win_tile))
                ;
                bVar4 = false;
              }
            }
          }
          bVar3 = bVar5;
          bVar2 = bVar4;
        }
        lVar7 = 0x9a;
        if (((bVar6) || (lVar7 = 0x9c, bVar2)) || (lVar7 = 0x9e, bVar3)) {
          *(undefined2 *)((long)*fan_table + lVar7) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void adjust_by_waiting_form(const pack_t *concealed_packs, intptr_t pack_cnt, const tile_t *standing_tiles, intptr_t standing_cnt,
    tile_t win_tile, fan_table_t &fan_table) {
    // 全求人和四杠不计单钓将，也不可能有边张、嵌张
    if (fan_table[MELDED_HAND] || fan_table[FOUR_KONGS]) {
        return;
    }

    useful_table_t waiting_table;  // 听牌标记表
    if (!is_basic_form_wait(standing_tiles, standing_cnt, &waiting_table)) {
        return;
    }

    if (pack_cnt == 5) {  // 门清状态
        // 判断是否为七对听牌
        useful_table_t temp_table;
        if (is_seven_pairs_wait(standing_tiles, standing_cnt, &temp_table)) {
            // 合并听牌标记表
            std::transform(std::begin(temp_table), std::end(temp_table), std::begin(waiting_table),
                std::begin(waiting_table), [](bool w, bool t) { return w || t; });
        }
    }

    // 统计听牌张数，听牌数大于1张，不计边张、嵌张、单钓将
    if (1 != std::count(std::begin(waiting_table), std::end(waiting_table), true)) {
        return;
    }

    // 听1张的情况，看和牌张处于什么位置
    // 边张0x01 嵌张0x02 单钓将0x04
    uint8_t pos_flag = 0;

    for (intptr_t i = 0; i < pack_cnt; ++i) {
        switch (pack_get_type(concealed_packs[i])) {
        case PACK_TYPE_CHOW: {
            tile_t mid_tile = pack_get_tile(concealed_packs[i]);
            if (mid_tile == win_tile) {
                pos_flag |= 0x02U;  // 嵌张
            }
            else if (mid_tile + 1 == win_tile || mid_tile - 1 == win_tile) {
                pos_flag |= 0x01U;  // 边张
            }
            break;
        }
        case PACK_TYPE_PAIR: {
            tile_t mid_tile = pack_get_tile(concealed_packs[i]);
            if (mid_tile == win_tile) {
                pos_flag |= 0x04U;  // 单钓将
            }
            break;
        }
        default:
            break;
        }
    }

    // 当多种可能存在时，只能计其中一种
    if (pos_flag & 0x01U) {
        fan_table[EDGE_WAIT] = 1;
    }
    else if (pos_flag & 0x02U) {
        fan_table[CLOSED_WAIT] = 1;
    }
    else if (pos_flag & 0x04U) {
        fan_table[SINGLE_WAIT] = 1;
    }
}